

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::ParseType(Parser *this,Type *type)

{
  StructDef **ppSVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  undefined8 *in_RDX;
  uint16_t fixed_length;
  unsigned_short local_6a;
  long *local_68 [2];
  long local_58 [2];
  undefined2 *local_48;
  undefined2 uStack_40;
  undefined6 uStack_3e;
  undefined2 uStack_38;
  undefined6 uStack_36;
  undefined2 uStack_30;
  
  if (*(int *)&type->field_0x1c == 0x5b) {
    iVar5 = *(int *)&type[0x3b].field_0x1c;
    if (0x40 < iVar5) {
      __assert_fail("caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) && \"Check() must be called to prevent stack overflow\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                    ,0x19d,"flatbuffers::Parser::ParseDepthGuard::ParseDepthGuard(Parser *)");
    }
    *(int *)&type[0x3b].field_0x1c = iVar5 + 1;
    if (iVar5 == 0x40) {
      RecurseError(this);
    }
    else {
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        uStack_38 = 0;
        uStack_36 = 0;
        uStack_30 = 0;
        local_48 = (undefined2 *)0x0;
        uStack_40 = 0;
        uStack_3e = 0;
        ParseType(this,type);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010afea;
        uVar3 = (uint)local_48;
        if (((uint)local_48 < 0x13) && ((0x64000U >> ((uint)local_48 & 0x1f) & 1) != 0)) {
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_68,"nested vector types not supported (wrap in table first)",""
                    );
          Error(this,(string *)type);
          goto LAB_0010afd3;
        }
        if (*(int *)&type->field_0x1c == 0x3a) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            if (*(int *)&type->field_0x1c == 0x102) {
              local_6a = 0;
              bVar4 = StringToNumber<unsigned_short>((char *)type[1].struct_def,&local_6a);
              if (bVar4 && local_6a != 0) {
                *in_RDX = 0x11;
                in_RDX[1] = CONCAT62(uStack_3e,uStack_40);
                in_RDX[2] = CONCAT62(uStack_36,uStack_38);
                *(unsigned_short *)(in_RDX + 3) = local_6a;
                Next(this);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0010b0f1;
                goto LAB_0010afea;
              }
              local_68[0] = local_58;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_68,
                         "length of fixed-length array must be positive and fit to uint16_t type",""
                        );
              Error(this,(string *)type);
            }
            else {
              local_68[0] = local_58;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_68,"length of fixed-length array must be an integer value",
                         "");
              Error(this,(string *)type);
            }
LAB_0010afd3:
            if (local_68[0] != local_58) {
              operator_delete(local_68[0],local_58[0] + 1);
            }
          }
          goto LAB_0010afea;
        }
        *in_RDX = 0xe;
        in_RDX[1] = CONCAT62(uStack_3e,uStack_40);
        in_RDX[2] = CONCAT62(uStack_36,uStack_38);
        *(undefined2 *)(in_RDX + 3) = 0;
LAB_0010b0f1:
        *(uint *)((long)in_RDX + 4) = uVar3;
        Expect(this,(int)type);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        cVar2 = *(char *)&(this->super_ParserState).prev_cursor_;
        *(int *)&type[0x3b].field_0x1c = *(int *)&type[0x3b].field_0x1c + -1;
        goto joined_r0x0010b114;
      }
    }
LAB_0010afea:
    *(int *)&type[0x3b].field_0x1c = *(int *)&type[0x3b].field_0x1c + -1;
  }
  else {
    if (*(int *)&type->field_0x1c != 0x104) {
      local_48 = &uStack_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"illegal type syntax","");
      Error(this,(string *)type);
      if (local_48 != &uStack_38) {
        operator_delete(local_48,CONCAT62(uStack_36,uStack_38) + 1);
      }
      goto LAB_0010b1c9;
    }
    ppSVar1 = &type[1].struct_def;
    iVar5 = std::__cxx11::string::compare((char *)ppSVar1);
    if (iVar5 == 0) {
      *(undefined4 *)in_RDX = 2;
LAB_0010b1b0:
      Next(this);
    }
    else {
      if (((*(int *)&type->field_0x1c == 0x104) &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) ||
         ((*(int *)&type->field_0x1c == 0x104 &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)))) {
        *(undefined4 *)in_RDX = 3;
        goto LAB_0010b1b0;
      }
      if (((*(int *)&type->field_0x1c == 0x104) &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) ||
         ((*(int *)&type->field_0x1c == 0x104 &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)))) {
        *(undefined4 *)in_RDX = 4;
        goto LAB_0010b1b0;
      }
      if (((*(int *)&type->field_0x1c == 0x104) &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) ||
         ((*(int *)&type->field_0x1c == 0x104 &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)))) {
        *(undefined4 *)in_RDX = 5;
        goto LAB_0010b1b0;
      }
      if (((*(int *)&type->field_0x1c == 0x104) &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) ||
         ((*(int *)&type->field_0x1c == 0x104 &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)))) {
        *(undefined4 *)in_RDX = 6;
        goto LAB_0010b1b0;
      }
      if (((*(int *)&type->field_0x1c == 0x104) &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) ||
         ((*(int *)&type->field_0x1c == 0x104 &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)))) {
        *(undefined4 *)in_RDX = 7;
        goto LAB_0010b1b0;
      }
      if (((*(int *)&type->field_0x1c == 0x104) &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) ||
         ((*(int *)&type->field_0x1c == 0x104 &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)))) {
        *(undefined4 *)in_RDX = 8;
        goto LAB_0010b1b0;
      }
      if (((*(int *)&type->field_0x1c == 0x104) &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) ||
         ((*(int *)&type->field_0x1c == 0x104 &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)))) {
        *(undefined4 *)in_RDX = 9;
        goto LAB_0010b1b0;
      }
      if (((*(int *)&type->field_0x1c == 0x104) &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) ||
         ((*(int *)&type->field_0x1c == 0x104 &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)))) {
        *(undefined4 *)in_RDX = 10;
        goto LAB_0010b1b0;
      }
      if (((*(int *)&type->field_0x1c == 0x104) &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) ||
         ((*(int *)&type->field_0x1c == 0x104 &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)))) {
        *(undefined4 *)in_RDX = 0xb;
        goto LAB_0010b1b0;
      }
      if (((*(int *)&type->field_0x1c == 0x104) &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) ||
         ((*(int *)&type->field_0x1c == 0x104 &&
          (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)))) {
        *(undefined4 *)in_RDX = 0xc;
        goto LAB_0010b1b0;
      }
      if ((*(int *)&type->field_0x1c == 0x104) &&
         (iVar5 = std::__cxx11::string::compare((char *)ppSVar1), iVar5 == 0)) {
        *(undefined4 *)in_RDX = 0xd;
        goto LAB_0010b1b0;
      }
      ParseTypeIdent(this,type);
    }
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    cVar2 = *(char *)&(this->super_ParserState).prev_cursor_;
joined_r0x0010b114:
    if (cVar2 == '\0') {
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
  }
LAB_0010b1c9:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseType(Type &type) {
  if (token_ == kTokenIdentifier) {
    if (IsIdent("bool")) {
      type.base_type = BASE_TYPE_BOOL;
      NEXT();
    } else if (IsIdent("byte") || IsIdent("int8")) {
      type.base_type = BASE_TYPE_CHAR;
      NEXT();
    } else if (IsIdent("ubyte") || IsIdent("uint8")) {
      type.base_type = BASE_TYPE_UCHAR;
      NEXT();
    } else if (IsIdent("short") || IsIdent("int16")) {
      type.base_type = BASE_TYPE_SHORT;
      NEXT();
    } else if (IsIdent("ushort") || IsIdent("uint16")) {
      type.base_type = BASE_TYPE_USHORT;
      NEXT();
    } else if (IsIdent("int") || IsIdent("int32")) {
      type.base_type = BASE_TYPE_INT;
      NEXT();
    } else if (IsIdent("uint") || IsIdent("uint32")) {
      type.base_type = BASE_TYPE_UINT;
      NEXT();
    } else if (IsIdent("long") || IsIdent("int64")) {
      type.base_type = BASE_TYPE_LONG;
      NEXT();
    } else if (IsIdent("ulong") || IsIdent("uint64")) {
      type.base_type = BASE_TYPE_ULONG;
      NEXT();
    } else if (IsIdent("float") || IsIdent("float32")) {
      type.base_type = BASE_TYPE_FLOAT;
      NEXT();
    } else if (IsIdent("double") || IsIdent("float64")) {
      type.base_type = BASE_TYPE_DOUBLE;
      NEXT();
    } else if (IsIdent("string")) {
      type.base_type = BASE_TYPE_STRING;
      NEXT();
    } else {
      ECHECK(ParseTypeIdent(type));
    }
  } else if (token_ == '[') {
    ParseDepthGuard depth_guard(this);
    ECHECK(depth_guard.Check());
    NEXT();
    Type subtype;
    ECHECK(ParseType(subtype));
    if (IsSeries(subtype)) {
      // We could support this, but it will complicate things, and it's
      // easier to work around with a struct around the inner vector.
      return Error("nested vector types not supported (wrap in table first)");
    }
    if (token_ == ':') {
      NEXT();
      if (token_ != kTokenIntegerConstant) {
        return Error("length of fixed-length array must be an integer value");
      }
      uint16_t fixed_length = 0;
      bool check = StringToNumber(attribute_.c_str(), &fixed_length);
      if (!check || fixed_length < 1) {
        return Error(
            "length of fixed-length array must be positive and fit to "
            "uint16_t type");
      }
      type = Type(BASE_TYPE_ARRAY, subtype.struct_def, subtype.enum_def,
                  fixed_length);
      NEXT();
    } else {
      type = Type(BASE_TYPE_VECTOR, subtype.struct_def, subtype.enum_def);
    }
    type.element = subtype.base_type;
    EXPECT(']');
  } else {
    return Error("illegal type syntax");
  }
  return NoError();
}